

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

QVariant * __thiscall
QSQLiteResult::lastInsertId(QVariant *__return_storage_ptr__,QSQLiteResult *this)

{
  long lVar1;
  char cVar2;
  sqlite3_int64 sVar3;
  
  lVar1 = *(long *)&this->field_0x8;
  cVar2 = QSqlResult::isActive();
  if ((cVar2 != '\0') &&
     (sVar3 = sqlite3_last_insert_rowid
                        (*(sqlite3 **)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8)), sVar3 != 0))
  {
    QVariant::QVariant(__return_storage_ptr__,sVar3);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QSQLiteResult::lastInsertId() const
{
    Q_D(const QSQLiteResult);
    if (isActive()) {
        qint64 id = sqlite3_last_insert_rowid(d->drv_d_func()->access);
        if (id)
            return id;
    }
    return QVariant();
}